

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall Polymer::~Polymer(Polymer *this)

{
  _Atomic_word *p_Var1;
  pointer pdVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  
  this->_vptr_Polymer = (_func_int **)&PTR_Initialize_001a76f8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->uncovered_)._M_t);
  (this->mask_).super_MobileElement._vptr_MobileElement = (_func_int **)&PTR__Mask_001a74b0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&(this->mask_).interactions_._M_t);
  MobileElement::~MobileElement(&(this->mask_).super_MobileElement);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~unique_ptr(&(this->release_sites_).right);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~unique_ptr(&(this->release_sites_).left);
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector(&(this->release_sites_).intervals);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~unique_ptr(&(this->binding_sites_).right);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~unique_ptr(&(this->binding_sites_).left);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&(this->binding_sites_).intervals);
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector(&this->release_intervals_);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&this->binding_intervals_);
  pdVar2 = (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pcVar3 = (this->polymerases_).seq_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->polymerases_).seq_.field_2) {
    operator_delete(pcVar3);
  }
  std::
  vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ::~vector(&(this->polymerases_).polymerases_);
  pdVar2 = (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pcVar3 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->name_).field_2) {
    operator_delete(pcVar3);
  }
  p_Var4 = (this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
               *)&this->termination_signal_);
  p_Var4 = (this->super_enable_shared_from_this<Polymer>)._M_weak_this.
           super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Polymer::~Polymer() {
  // The following code can be uncommented to check that
  // polymers are being properly destroyed during the simulation,
  // i.e. nothing is left uncovered/ no polymerases are bound. 
  // For debugging purposes only. 
  //
  /*std::cout << "Begin destroying polymer." << std::endl;
  if (polymerases_.pol_count() != 0) {
    std::cout << "WARNING: Attempting to destruct Polymer object with "
                 "Polymerases still "
                 "attached. Total propensity of polymer: " +
                     std::to_string(polymerases_.prop_sum())
              << std::endl;
  }
  for (auto const &site : uncovered_) {
    if (site.second != 0) {
      if (site.first == "__rnase_site" || site.first == "__rnase_site_ext") {
        LogCover(site.first);
      } else {
        std::cout << "WARNING: Attempting to destruct Polymer object with "
                     "uncovered binding "
                     "sites. Binding site name: " +
                         site.first
                  << std::endl;
      }
    }
  }*/
}